

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::getValueAsUTF8(QPDFObjectHandle *this,string *value)

{
  bool bVar1;
  string local_48;
  QPDF_String *local_28;
  QPDF_String *str;
  string *value_local;
  QPDFObjectHandle *this_local;
  
  str = (QPDF_String *)value;
  value_local = (string *)this;
  local_28 = ::qpdf::BaseHandle::as<QPDF_String>(&this->super_BaseHandle);
  bVar1 = local_28 != (QPDF_String *)0x0;
  if (bVar1) {
    QPDF_String::getUTF8Val_abi_cxx11_(&local_48,local_28);
    std::__cxx11::string::operator=((string *)str,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::getValueAsUTF8(std::string& value) const
{
    if (auto str = as<QPDF_String>()) {
        value = str->getUTF8Val();
        return true;
    }
    return false;
}